

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O2

bool crnlib::rg_etc1::unpack_etc1_block
               (void *pETC1_block,uint *pDst_pixels_rgba,bool preserve_alpha)

{
  byte bVar1;
  bool bVar2;
  uint16 uVar3;
  uint16 packed_delta3;
  uint uVar4;
  uint y_3;
  uint table_idx;
  uint y_1;
  uint y_2;
  uint y;
  uint uVar5;
  color_quad_u8 subblock_colors1 [4];
  color_quad_u8 subblock_colors0 [4];
  
  bVar1 = *(byte *)((long)pETC1_block + 3);
  table_idx = bVar1 >> 2 & 7;
  if ((bVar1 & 2) == 0) {
    uVar3 = etc1_block::get_base4_color((etc1_block *)pETC1_block,0);
    etc1_block::get_abs_subblock_colors(subblock_colors0,uVar3,(uint)(bVar1 >> 5));
    uVar3 = etc1_block::get_base4_color((etc1_block *)pETC1_block,1);
    etc1_block::get_abs_subblock_colors(subblock_colors1,uVar3,table_idx);
    bVar2 = true;
  }
  else {
    uVar3 = etc1_block::get_base5_color((etc1_block *)pETC1_block);
    packed_delta3 = etc1_block::get_delta3_color((etc1_block *)pETC1_block);
    etc1_block::get_diff_subblock_colors(subblock_colors0,uVar3,(uint)(bVar1 >> 5));
    bVar2 = etc1_block::get_diff_subblock_colors(subblock_colors1,uVar3,packed_delta3,table_idx);
  }
  if (preserve_alpha) {
    if ((bVar1 & 1) == 0) {
      for (uVar5 = 0; uVar5 != 4; uVar5 = uVar5 + 1) {
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,0,uVar5);
        *(component_t *)pDst_pixels_rgba = subblock_colors0[uVar4].field_0.field_0.r;
        *(component_t *)((long)pDst_pixels_rgba + 1) = subblock_colors0[uVar4].field_0.field_0.g;
        *(component_t *)((long)pDst_pixels_rgba + 2) = subblock_colors0[uVar4].field_0.field_0.b;
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,1,uVar5);
        *(component_t *)(pDst_pixels_rgba + 1) = subblock_colors0[uVar4].field_0.field_0.r;
        *(component_t *)((long)pDst_pixels_rgba + 5) = subblock_colors0[uVar4].field_0.field_0.g;
        *(component_t *)((long)pDst_pixels_rgba + 6) = subblock_colors0[uVar4].field_0.field_0.b;
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,2,uVar5);
        *(component_t *)(pDst_pixels_rgba + 2) = subblock_colors1[uVar4].field_0.field_0.r;
        *(component_t *)((long)pDst_pixels_rgba + 9) = subblock_colors1[uVar4].field_0.field_0.g;
        *(component_t *)((long)pDst_pixels_rgba + 10) = subblock_colors1[uVar4].field_0.field_0.b;
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,3,uVar5);
        *(component_t *)(pDst_pixels_rgba + 3) = subblock_colors1[uVar4].field_0.field_0.r;
        *(component_t *)((long)pDst_pixels_rgba + 0xd) = subblock_colors1[uVar4].field_0.field_0.g;
        *(component_t *)((long)pDst_pixels_rgba + 0xe) = subblock_colors1[uVar4].field_0.field_0.b;
        pDst_pixels_rgba = pDst_pixels_rgba + 4;
      }
    }
    else {
      for (uVar5 = 0; uVar5 != 2; uVar5 = uVar5 + 1) {
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,0,uVar5);
        *(component_t *)pDst_pixels_rgba = subblock_colors0[uVar4].field_0.field_0.r;
        *(component_t *)((long)pDst_pixels_rgba + 1) = subblock_colors0[uVar4].field_0.field_0.g;
        *(component_t *)((long)pDst_pixels_rgba + 2) = subblock_colors0[uVar4].field_0.field_0.b;
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,1,uVar5);
        *(component_t *)(pDst_pixels_rgba + 1) = subblock_colors0[uVar4].field_0.field_0.r;
        *(component_t *)((long)pDst_pixels_rgba + 5) = subblock_colors0[uVar4].field_0.field_0.g;
        *(component_t *)((long)pDst_pixels_rgba + 6) = subblock_colors0[uVar4].field_0.field_0.b;
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,2,uVar5);
        *(component_t *)(pDst_pixels_rgba + 2) = subblock_colors0[uVar4].field_0.field_0.r;
        *(component_t *)((long)pDst_pixels_rgba + 9) = subblock_colors0[uVar4].field_0.field_0.g;
        *(component_t *)((long)pDst_pixels_rgba + 10) = subblock_colors0[uVar4].field_0.field_0.b;
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,3,uVar5);
        *(component_t *)(pDst_pixels_rgba + 3) = subblock_colors0[uVar4].field_0.field_0.r;
        *(component_t *)((long)pDst_pixels_rgba + 0xd) = subblock_colors0[uVar4].field_0.field_0.g;
        *(component_t *)((long)pDst_pixels_rgba + 0xe) = subblock_colors0[uVar4].field_0.field_0.b;
        pDst_pixels_rgba = pDst_pixels_rgba + 4;
      }
      for (uVar5 = 2; uVar5 != 4; uVar5 = uVar5 + 1) {
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,0,uVar5);
        *(component_t *)pDst_pixels_rgba = subblock_colors1[uVar4].field_0.field_0.r;
        *(component_t *)((long)pDst_pixels_rgba + 1) = subblock_colors1[uVar4].field_0.field_0.g;
        *(component_t *)((long)pDst_pixels_rgba + 2) = subblock_colors1[uVar4].field_0.field_0.b;
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,1,uVar5);
        *(component_t *)(pDst_pixels_rgba + 1) = subblock_colors1[uVar4].field_0.field_0.r;
        *(component_t *)((long)pDst_pixels_rgba + 5) = subblock_colors1[uVar4].field_0.field_0.g;
        *(component_t *)((long)pDst_pixels_rgba + 6) = subblock_colors1[uVar4].field_0.field_0.b;
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,2,uVar5);
        *(component_t *)(pDst_pixels_rgba + 2) = subblock_colors1[uVar4].field_0.field_0.r;
        *(component_t *)((long)pDst_pixels_rgba + 9) = subblock_colors1[uVar4].field_0.field_0.g;
        *(component_t *)((long)pDst_pixels_rgba + 10) = subblock_colors1[uVar4].field_0.field_0.b;
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,3,uVar5);
        *(component_t *)(pDst_pixels_rgba + 3) = subblock_colors1[uVar4].field_0.field_0.r;
        *(component_t *)((long)pDst_pixels_rgba + 0xd) = subblock_colors1[uVar4].field_0.field_0.g;
        *(component_t *)((long)pDst_pixels_rgba + 0xe) = subblock_colors1[uVar4].field_0.field_0.b;
        pDst_pixels_rgba = pDst_pixels_rgba + 4;
      }
    }
  }
  else {
    uVar5 = 0;
    if ((bVar1 & 1) == 0) {
      for (; uVar5 != 4; uVar5 = uVar5 + 1) {
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,0,uVar5);
        *pDst_pixels_rgba = (uint)subblock_colors0[uVar4].field_0;
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,1,uVar5);
        ((anon_union_4_3_dd316fa8_for_color_quad_u8_0 *)pDst_pixels_rgba)[1] =
             subblock_colors0[uVar4].field_0;
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,2,uVar5);
        ((anon_union_4_3_dd316fa8_for_color_quad_u8_0 *)pDst_pixels_rgba)[2] =
             subblock_colors1[uVar4].field_0;
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,3,uVar5);
        ((anon_union_4_3_dd316fa8_for_color_quad_u8_0 *)pDst_pixels_rgba)[3] =
             subblock_colors1[uVar4].field_0;
        pDst_pixels_rgba =
             (uint *)((anon_union_4_3_dd316fa8_for_color_quad_u8_0 *)pDst_pixels_rgba + 4);
      }
    }
    else {
      for (; uVar5 != 2; uVar5 = uVar5 + 1) {
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,0,uVar5);
        *pDst_pixels_rgba = (uint)subblock_colors0[uVar4].field_0;
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,1,uVar5);
        ((anon_union_4_3_dd316fa8_for_color_quad_u8_0 *)pDst_pixels_rgba)[1] =
             subblock_colors0[uVar4].field_0;
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,2,uVar5);
        ((anon_union_4_3_dd316fa8_for_color_quad_u8_0 *)pDst_pixels_rgba)[2] =
             subblock_colors0[uVar4].field_0;
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,3,uVar5);
        ((anon_union_4_3_dd316fa8_for_color_quad_u8_0 *)pDst_pixels_rgba)[3] =
             subblock_colors0[uVar4].field_0;
        pDst_pixels_rgba =
             (uint *)((anon_union_4_3_dd316fa8_for_color_quad_u8_0 *)pDst_pixels_rgba + 4);
      }
      for (uVar5 = 2; uVar5 != 4; uVar5 = uVar5 + 1) {
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,0,uVar5);
        *pDst_pixels_rgba = (uint)subblock_colors1[uVar4].field_0;
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,1,uVar5);
        ((anon_union_4_3_dd316fa8_for_color_quad_u8_0 *)pDst_pixels_rgba)[1] =
             subblock_colors1[uVar4].field_0;
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,2,uVar5);
        ((anon_union_4_3_dd316fa8_for_color_quad_u8_0 *)pDst_pixels_rgba)[2] =
             subblock_colors1[uVar4].field_0;
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,3,uVar5);
        ((anon_union_4_3_dd316fa8_for_color_quad_u8_0 *)pDst_pixels_rgba)[3] =
             subblock_colors1[uVar4].field_0;
        pDst_pixels_rgba =
             (uint *)((anon_union_4_3_dd316fa8_for_color_quad_u8_0 *)pDst_pixels_rgba + 4);
      }
    }
  }
  return bVar2;
}

Assistant:

bool unpack_etc1_block(const void* pETC1_block, unsigned int* pDst_pixels_rgba, bool preserve_alpha)
        {
            color_quad_u8* pDst = reinterpret_cast<color_quad_u8*>(pDst_pixels_rgba);
            const etc1_block& block = *static_cast<const etc1_block*>(pETC1_block);

            const bool diff_flag = block.get_diff_bit();
            const bool flip_flag = block.get_flip_bit();
            const uint table_index0 = block.get_inten_table(0);
            const uint table_index1 = block.get_inten_table(1);

            color_quad_u8 subblock_colors0[4];
            color_quad_u8 subblock_colors1[4];
            bool success = true;

            if (diff_flag)
            {
                const uint16 base_color5 = block.get_base5_color();
                const uint16 delta_color3 = block.get_delta3_color();
                etc1_block::get_diff_subblock_colors(subblock_colors0, base_color5, table_index0);

                if (!etc1_block::get_diff_subblock_colors(subblock_colors1, base_color5, delta_color3, table_index1))
                {
                    success = false;
                }
            }
            else
            {
                const uint16 base_color4_0 = block.get_base4_color(0);
                etc1_block::get_abs_subblock_colors(subblock_colors0, base_color4_0, table_index0);

                const uint16 base_color4_1 = block.get_base4_color(1);
                etc1_block::get_abs_subblock_colors(subblock_colors1, base_color4_1, table_index1);
            }

            if (preserve_alpha)
            {
                if (flip_flag)
                {
                    for (uint y = 0; y < 2; y++)
                    {
                        pDst[0].set_rgb(subblock_colors0[block.get_selector(0, y)]);
                        pDst[1].set_rgb(subblock_colors0[block.get_selector(1, y)]);
                        pDst[2].set_rgb(subblock_colors0[block.get_selector(2, y)]);
                        pDst[3].set_rgb(subblock_colors0[block.get_selector(3, y)]);
                        pDst += 4;
                    }

                    for (uint y = 2; y < 4; y++)
                    {
                        pDst[0].set_rgb(subblock_colors1[block.get_selector(0, y)]);
                        pDst[1].set_rgb(subblock_colors1[block.get_selector(1, y)]);
                        pDst[2].set_rgb(subblock_colors1[block.get_selector(2, y)]);
                        pDst[3].set_rgb(subblock_colors1[block.get_selector(3, y)]);
                        pDst += 4;
                    }
                }
                else
                {
                    for (uint y = 0; y < 4; y++)
                    {
                        pDst[0].set_rgb(subblock_colors0[block.get_selector(0, y)]);
                        pDst[1].set_rgb(subblock_colors0[block.get_selector(1, y)]);
                        pDst[2].set_rgb(subblock_colors1[block.get_selector(2, y)]);
                        pDst[3].set_rgb(subblock_colors1[block.get_selector(3, y)]);
                        pDst += 4;
                    }
                }
            }
            else
            {
                if (flip_flag)
                {
                    // 0000
                    // 0000
                    // 1111
                    // 1111
                    for (uint y = 0; y < 2; y++)
                    {
                        pDst[0] = subblock_colors0[block.get_selector(0, y)];
                        pDst[1] = subblock_colors0[block.get_selector(1, y)];
                        pDst[2] = subblock_colors0[block.get_selector(2, y)];
                        pDst[3] = subblock_colors0[block.get_selector(3, y)];
                        pDst += 4;
                    }

                    for (uint y = 2; y < 4; y++)
                    {
                        pDst[0] = subblock_colors1[block.get_selector(0, y)];
                        pDst[1] = subblock_colors1[block.get_selector(1, y)];
                        pDst[2] = subblock_colors1[block.get_selector(2, y)];
                        pDst[3] = subblock_colors1[block.get_selector(3, y)];
                        pDst += 4;
                    }
                }
                else
                {
                    // 0011
                    // 0011
                    // 0011
                    // 0011
                    for (uint y = 0; y < 4; y++)
                    {
                        pDst[0] = subblock_colors0[block.get_selector(0, y)];
                        pDst[1] = subblock_colors0[block.get_selector(1, y)];
                        pDst[2] = subblock_colors1[block.get_selector(2, y)];
                        pDst[3] = subblock_colors1[block.get_selector(3, y)];
                        pDst += 4;
                    }
                }
            }

            return success;
        }